

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrShareSpacesInfoMETA *value)

{
  pointer *this;
  pointer *this_00;
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  allocator local_5c1;
  string local_5c0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_5a0;
  allocator local_581;
  string local_580 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_560;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [8];
  string error_message_1;
  XrShareSpacesRecipientGroupsMETA *new_sharespacesrecipientgroupsmeta_value;
  string local_4e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4c8;
  allocator local_4a9;
  string local_4a8 [32];
  string local_488 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_468;
  allocator local_449;
  string local_448 [32];
  XrSpace_T local_428 [32];
  ostringstream local_408 [8];
  ostringstream oss;
  uint local_288;
  ValidateXrHandleResult handle_result;
  uint32_t value_spaces_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrShareSpacesInfoMETA *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_SHARE_SPACES_INFO_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrShareSpacesInfoMETA",value->type,
               "VUID-XrShareSpacesInfoMETA-type-type",XR_TYPE_SHARE_SPACES_INFO_META,
               "XR_TYPE_SHARE_SPACES_INFO_META");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrShareSpacesInfoMETA-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrShareSpacesInfoMETA struct \"next\"",
                 &local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrShareSpacesInfoMETA : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"VUID-XrShareSpacesInfoMETA-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrShareSpacesInfoMETA struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    if ((value->spaceCount == 0) && (value->spaces != (XrSpace *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"VUID-XrShareSpacesInfoMETA-spaceCount-arraylength",&local_1d9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_218,
                 "Structure XrShareSpacesInfoMETA member spaceCount is non-optional and must be greater than 0"
                 ,&local_219);
      CoreValidLogMessage(instance_info,(string *)local_1d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1f8,(string *)local_218);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1f8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    if ((value->spaces == (XrSpace *)0x0) && (value->spaceCount != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_240,"VUID-XrShareSpacesInfoMETA-spaces-parameter",&local_241);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_260,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&value_spaces_inc,
                 "XrShareSpacesInfoMETA contains invalid NULL for XrSpace \"spaces\" is which not optional since \"spaceCount\" is set and must be non-NULL"
                 ,(allocator *)((long)&handle_result + 3));
      CoreValidLogMessage(instance_info,(string *)local_240,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_260,(string *)&value_spaces_inc);
      std::__cxx11::string::~string((string *)&value_spaces_inc);
      std::allocator<char>::~allocator((allocator<char> *)((long)&handle_result + 3));
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_260);
      std::__cxx11::string::~string(local_240);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else {
      if (value->spaces != (XrSpace *)0x0) {
        for (local_288 = 0; local_288 < value->spaceCount; local_288 = local_288 + 1) {
          VVar1 = VerifyXrSpaceHandle(value->spaces + local_288);
          if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
            std::__cxx11::ostringstream::ostringstream(local_408);
            std::operator<<((ostream *)local_408,"Invalid XrSpace handle \"spaces\" ");
            HandleToHexString<XrSpace_T*>(local_428);
            std::operator<<((ostream *)local_408,(string *)local_428);
            std::__cxx11::string::~string((string *)local_428);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_448,"VUID-XrShareSpacesInfoMETA-spaces-parameter",&local_449);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector(&local_468,objects_info);
            std::__cxx11::ostringstream::str();
            CoreValidLogMessage(instance_info,(string *)local_448,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,&local_468,local_488);
            std::__cxx11::string::~string((string *)local_488);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector(&local_468);
            std::__cxx11::string::~string(local_448);
            std::allocator<char>::~allocator((allocator<char> *)&local_449);
            std::__cxx11::ostringstream::~ostringstream(local_408);
            return XR_ERROR_HANDLE_INVALID;
          }
        }
      }
      if (value->recipientInfo == (XrShareSpacesRecipientBaseHeaderMETA *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4a8,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",&local_4a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_4c8,objects_info);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4e8,
                   "XrShareSpacesInfoMETA contains invalid NULL for XrShareSpacesRecipientBaseHeaderMETA \"recipientInfo\" which is not optional and must be non-NULL"
                   ,(allocator *)((long)&new_sharespacesrecipientgroupsmeta_value + 7));
        CoreValidLogMessage(instance_info,(string *)local_4a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_4c8,(string *)local_4e8);
        std::__cxx11::string::~string(local_4e8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&new_sharespacesrecipientgroupsmeta_value + 7));
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_4c8);
        std::__cxx11::string::~string(local_4a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      }
      else if ((((XrShareSpacesRecipientGroupsMETA *)value->recipientInfo)->type ==
                XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) &&
              (XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        (XrShareSpacesRecipientGroupsMETA *)value->recipientInfo),
              XVar2 != XR_SUCCESS)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_518,"Structure XrShareSpacesInfoMETA member recipientInfo",&local_519);
        std::allocator<char>::~allocator((allocator<char> *)&local_519);
        std::__cxx11::string::operator+=(local_518," is invalid");
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_540,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",&local_541);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_560,objects_info);
        CoreValidLogMessage(instance_info,(string *)local_540,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_560,(string *)local_518);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_560);
        std::__cxx11::string::~string(local_540);
        std::allocator<char>::~allocator((allocator<char> *)&local_541);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::string::~string(local_518);
      }
      else {
        instance_info_local._4_4_ =
             ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                              value->recipientInfo);
        if (instance_info_local._4_4_ != XR_SUCCESS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_580,"VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",&local_581);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_5a0,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5c0,"Structure XrShareSpacesInfoMETA member recipientInfo is invalid",
                     &local_5c1);
          CoreValidLogMessage(instance_info,(string *)local_580,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_5a0,(string *)local_5c0);
          std::__cxx11::string::~string(local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_5a0);
          std::__cxx11::string::~string(local_580);
          std::allocator<char>::~allocator((allocator<char> *)&local_581);
        }
      }
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrShareSpacesInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SHARE_SPACES_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrShareSpacesInfoMETA",
                             value->type, "VUID-XrShareSpacesInfoMETA-type-type", XR_TYPE_SHARE_SPACES_INFO_META, "XR_TYPE_SHARE_SPACES_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrShareSpacesInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrShareSpacesInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrShareSpacesInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->spaceCount && nullptr != value->spaces) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaceCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrShareSpacesInfoMETA member spaceCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->spaces && 0 != value->spaceCount) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaces-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrShareSpacesInfoMETA contains invalid NULL for XrSpace \"spaces\" is which not "
                            "optional since \"spaceCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->spaces) {
        for (uint32_t value_spaces_inc = 0; value_spaces_inc < value->spaceCount; ++value_spaces_inc) {
            {
                // writeValidateInlineHandleValidation
                ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->spaces[value_spaces_inc]);
                if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                    // Not a valid handle or NULL (which is not valid in this case)
                    std::ostringstream oss;
                    oss << "Invalid XrSpace handle \"spaces\" ";
                    oss << HandleToHexString(value->spaces[value_spaces_inc]);
                    CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-spaces-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info, oss.str());
                    return XR_ERROR_HANDLE_INVALID;
                }
            }
        }
    }
    // Non-optional pointer/array variable that needs to not be NULL
    if (nullptr == value->recipientInfo) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrShareSpacesInfoMETA contains invalid NULL for XrShareSpacesRecipientBaseHeaderMETA \"recipientInfo\" which is not "
                            "optional and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate if XrShareSpacesRecipientBaseHeaderMETA is a child structure of type XrShareSpacesRecipientGroupsMETA and it is valid
    {
        const XrShareSpacesRecipientGroupsMETA* new_sharespacesrecipientgroupsmeta_value = reinterpret_cast<const XrShareSpacesRecipientGroupsMETA*>(value->recipientInfo);
        if (new_sharespacesrecipientgroupsmeta_value->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_sharespacesrecipientgroupsmeta_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrShareSpacesInfoMETA member recipientInfo";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate that the base-structure XrShareSpacesRecipientBaseHeaderMETA is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, value->recipientInfo);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrShareSpacesInfoMETA-recipientInfo-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrShareSpacesInfoMETA member recipientInfo is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}